

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall H264StreamReader::processPPS(H264StreamReader *this,uint8_t *buff)

{
  PPSUnit *this_00;
  PPSUnit *this_01;
  uint8_t *end;
  mapped_type *ppPVar1;
  int nalRez;
  uint8_t *nextNal;
  PPSUnit *pps;
  uint8_t *buff_local;
  H264StreamReader *this_local;
  
  this_01 = (PPSUnit *)operator_new(0x58);
  PPSUnit::PPSUnit(this_01);
  end = NALUnit::findNALWithStartCode
                  (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
  NALUnit::decodeBuffer((NALUnit *)this_01,buff,end);
  this_local._4_4_ = PPSUnit::deserialize(this_01);
  if (this_local._4_4_ == 0) {
    ppPVar1 = std::
              map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
              ::operator[](&this->m_ppsMap,&this_01->pic_parameter_set_id);
    this_00 = *ppPVar1;
    if (this_00 != (PPSUnit *)0x0) {
      PPSUnit::~PPSUnit(this_00);
      operator_delete(this_00,0x58);
    }
    ppPVar1 = std::
              map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
              ::operator[](&this->m_ppsMap,&this_01->pic_parameter_set_id);
    *ppPVar1 = this_01;
    this_local._4_4_ = 0;
  }
  else if (this_01 != (PPSUnit *)0x0) {
    PPSUnit::~PPSUnit(this_01);
    operator_delete(this_01,0x58);
  }
  return this_local._4_4_;
}

Assistant:

int H264StreamReader::processPPS(uint8_t *buff)
{
    auto *pps = new PPSUnit();
    const uint8_t *nextNal = NALUnit::findNALWithStartCode(buff, m_bufEnd, true);

    pps->decodeBuffer(buff, nextNal);
    const int nalRez = pps->deserialize();
    if (nalRez != 0)
    {
        delete pps;
        return nalRez;  // not enough buffer
    }
    delete m_ppsMap[pps->pic_parameter_set_id];
    m_ppsMap[pps->pic_parameter_set_id] = pps;
    return 0;
}